

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getinteger(HSQUIRRELVM v,SQInteger idx,SQInteger *i)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *o;
  SQObjectValue SVar3;
  
  o = stack_get(v,idx);
  SVar1 = (o->super_SQObject)._type;
  if ((SVar1 >> 0x1a & 1) == 0) {
    if (SVar1 != OT_BOOL) {
      return -1;
    }
    bVar2 = SQVM::IsFalse(o);
    SVar3._0_1_ = !bVar2;
    SVar3.nInteger._1_7_ = 0;
  }
  else if (SVar1 == OT_FLOAT) {
    SVar3.nInteger = (SQInteger)(o->super_SQObject)._unVal.fFloat;
  }
  else {
    SVar3 = (o->super_SQObject)._unVal;
  }
  *i = (SQInteger)SVar3;
  return 0;
}

Assistant:

SQRESULT sq_getinteger(HSQUIRRELVM v,SQInteger idx,SQInteger *i)
{
    SQObjectPtr &o = stack_get(v, idx);
    if(sq_isnumeric(o)) {
        *i = tointeger(o);
        return SQ_OK;
    }
    if(sq_isbool(o)) {
        *i = SQVM::IsFalse(o)?SQFalse:SQTrue;
        return SQ_OK;
    }
    return SQ_ERROR;
}